

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

string * utilities::ltrim(string *s)

{
  string *in_RSI;
  string *in_RDI;
  size_t start;
  allocator local_19;
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find_first_not_of(in_RSI,0x15a5d8);
  if (local_18 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  return in_RDI;
}

Assistant:

std::string ltrim(const std::string& s)
    {
        size_t start = s.find_first_not_of(WHITESPACE);
        return (start == std::string::npos) ? "" : s.substr(start);
    }